

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeExprOrVector(Parse *pParse,Expr *p,int iReg,int nReg)

{
  ExprList *pEVar1;
  Vdbe *p_00;
  u8 uVar2;
  int p1;
  Select *pSVar3;
  long lVar4;
  
  if (p == (Expr *)0x0) {
    p = (Expr *)0x0;
  }
  else {
    uVar2 = p->op;
    if (uVar2 == 0xb0) {
      uVar2 = p->op2;
    }
    pSVar3 = (Select *)p;
    if (uVar2 != 0xb1) {
      if (uVar2 != 0x8a) goto LAB_00189c5b;
      pSVar3 = (p->x).pSelect;
    }
    if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar3->pEList)->pList->nExpr) {
      if ((p->flags & 0x1000) != 0) {
        p_00 = pParse->pVdbe;
        p1 = sqlite3CodeSubselect(pParse,p);
        sqlite3VdbeAddOp3(p_00,0x50,p1,iReg,nReg + -1);
        return;
      }
      if (0 < nReg) {
        pEVar1 = (p->x).pList;
        lVar4 = 0;
        do {
          sqlite3ExprCode(pParse,*(Expr **)((long)&pEVar1->a[0].pExpr + lVar4),iReg);
          iReg = iReg + 1;
          lVar4 = lVar4 + 0x18;
        } while ((ulong)(uint)nReg * 0x18 != lVar4);
      }
      return;
    }
  }
LAB_00189c5b:
  sqlite3ExprCode(pParse,p,iReg);
  return;
}

Assistant:

static void codeExprOrVector(Parse *pParse, Expr *p, int iReg, int nReg){
  assert( nReg>0 );
  if( p && sqlite3ExprIsVector(p) ){
#ifndef SQLITE_OMIT_SUBQUERY
    if( ExprUseXSelect(p) ){
      Vdbe *v = pParse->pVdbe;
      int iSelect;
      assert( p->op==TK_SELECT );
      iSelect = sqlite3CodeSubselect(pParse, p);
      sqlite3VdbeAddOp3(v, OP_Copy, iSelect, iReg, nReg-1);
    }else
#endif
    {
      int i;
      const ExprList *pList;
      assert( ExprUseXList(p) );
      pList = p->x.pList;
      assert( nReg<=pList->nExpr );
      for(i=0; i<nReg; i++){
        sqlite3ExprCode(pParse, pList->a[i].pExpr, iReg+i);
      }
    }
  }else{
    assert( nReg==1 || pParse->nErr );
    sqlite3ExprCode(pParse, p, iReg);
  }
}